

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IColourImpl * Catch::anon_unknown_1::platformColourInstance(void)

{
  int iVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  int iVar3;
  int *piVar4;
  long *plVar5;
  undefined1 *puVar6;
  undefined **ppuVar7;
  
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  if (IMutableContext::currentContext == (undefined8 *)0x0) {
    IMutableContext::currentContext = (undefined8 *)operator_new(0x30);
    ppuVar7 = &PTR__Context_00274ee0;
    *IMutableContext::currentContext = &PTR__Context_00274ee0;
    IMutableContext::currentContext[1] = &PTR__Context_00274f30;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
  }
  else {
    ppuVar7 = (undefined **)*IMutableContext::currentContext;
  }
  plVar5 = (long *)(*(code *)ppuVar7[4])();
  plVar2 = (long *)*plVar5;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  if (plVar2 == (long *)0x0) {
LAB_0011df4d:
    iVar3 = isatty(1);
    if (iVar3 != 0) goto LAB_0011df5b;
LAB_0011df6e:
    if ((anonymous_namespace)::NoColourImpl::instance()::s_instance != '\0') {
      ppuVar7 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
      goto LAB_0011df7f;
    }
    puVar6 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::NoColourImpl::instance()::s_instance);
    ppuVar7 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
  }
  else {
    iVar3 = (**(code **)(*plVar2 + 0x90))();
    if (iVar3 != 1) {
      if (iVar3 == 0) goto LAB_0011df4d;
      goto LAB_0011df6e;
    }
LAB_0011df5b:
    if ((anonymous_namespace)::PosixColourImpl::instance()::s_instance != '\0') {
      ppuVar7 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
      goto LAB_0011df7f;
    }
    puVar6 = &(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
    iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::PosixColourImpl::instance()::s_instance);
    ppuVar7 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
  }
  if (iVar3 != 0) {
    __cxa_guard_release(puVar6);
  }
LAB_0011df7f:
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  *piVar4 = iVar1;
  return (IColourImpl *)ppuVar7;
}

Assistant:

ErrnoGuard::~ErrnoGuard() { errno = m_oldErrno; }